

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

Char * Diligent::GetValueTypeString(VALUE_TYPE Val)

{
  int iVar1;
  char *pcVar2;
  char (*in_R8) [2];
  uint local_2c;
  string msg;
  
  if (GetValueTypeString(Diligent::VALUE_TYPE)::ValueTypeStrings == '\0') {
    iVar1 = __cxa_guard_acquire(&GetValueTypeString(Diligent::VALUE_TYPE)::ValueTypeStrings);
    if (iVar1 != 0) {
      GetValueTypeString::ValueTypeStrings.ValueTypeStrings._M_elems[0] = "VT_UNDEFINED";
      GetValueTypeString::ValueTypeStrings.ValueTypeStrings._M_elems[1] = "VT_INT8";
      GetValueTypeString::ValueTypeStrings.ValueTypeStrings._M_elems[2] = "VT_INT16";
      GetValueTypeString::ValueTypeStrings.ValueTypeStrings._M_elems[3] = "VT_INT32";
      GetValueTypeString::ValueTypeStrings.ValueTypeStrings._M_elems[4] = "VT_UINT8";
      GetValueTypeString::ValueTypeStrings.ValueTypeStrings._M_elems[5] = "VT_UINT16";
      GetValueTypeString::ValueTypeStrings.ValueTypeStrings._M_elems[6] = "VT_UINT32";
      GetValueTypeString::ValueTypeStrings.ValueTypeStrings._M_elems[7] = "VT_FLOAT16";
      GetValueTypeString::ValueTypeStrings.ValueTypeStrings._M_elems[8] = "VT_FLOAT32";
      GetValueTypeString::ValueTypeStrings.ValueTypeStrings._M_elems[9] = "VT_FLOAT64";
      __cxa_guard_release(&GetValueTypeString(Diligent::VALUE_TYPE)::ValueTypeStrings);
    }
  }
  if (Val < VT_NUM_TYPES) {
    pcVar2 = GetValueTypeString::ValueTypeStrings.ValueTypeStrings._M_elems[Val];
  }
  else {
    local_2c = (uint)Val;
    FormatString<char[23],unsigned_int,char[2]>
              (&msg,(Diligent *)"Incorrect value type (",(char (*) [23])&local_2c,(uint *)0x801c00,
               in_R8);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"operator[]",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x47);
    std::__cxx11::string::~string((string *)&msg);
    pcVar2 = "unknown value type";
  }
  return pcVar2;
}

Assistant:

const Char* GetValueTypeString(VALUE_TYPE Val)
{
    struct ValueTypeToStringMap
    {
        ValueTypeToStringMap()
        {
#define INIT_VALUE_TYPE_STR(ValType) ValueTypeStrings[ValType] = #ValType
            INIT_VALUE_TYPE_STR(VT_UNDEFINED);
            INIT_VALUE_TYPE_STR(VT_INT8);
            INIT_VALUE_TYPE_STR(VT_INT16);
            INIT_VALUE_TYPE_STR(VT_INT32);
            INIT_VALUE_TYPE_STR(VT_UINT8);
            INIT_VALUE_TYPE_STR(VT_UINT16);
            INIT_VALUE_TYPE_STR(VT_UINT32);
            INIT_VALUE_TYPE_STR(VT_FLOAT16);
            INIT_VALUE_TYPE_STR(VT_FLOAT32);
            INIT_VALUE_TYPE_STR(VT_FLOAT64);
#undef INIT_VALUE_TYPE_STR
            static_assert(VT_NUM_TYPES == 10, "Not all value type strings are initialized.");
        }

        const Char* operator[](VALUE_TYPE Val) const
        {
            if (Val < ValueTypeStrings.size())
            {
                return ValueTypeStrings[Val];
            }
            else
            {
                UNEXPECTED("Incorrect value type (", static_cast<Uint32>(Val), ")");
                return "unknown value type";
            }
        }

    private:
        std::array<const Char*, VT_NUM_TYPES> ValueTypeStrings{};
    };

    static const ValueTypeToStringMap ValueTypeStrings;
    return ValueTypeStrings[Val];
}